

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O0

int32 read_kd_nodes(FILE *fp,kd_tree_node_t *node,uint32 level)

{
  int32 iVar1;
  uint uVar2;
  int iVar3;
  uint8 *puVar4;
  kd_tree_node_t *pkVar5;
  uint local_28;
  int i;
  uint32 n;
  uint32 level_local;
  kd_tree_node_t *node_local;
  FILE *fp_local;
  
  i = level;
  _n = node;
  node_local = (kd_tree_node_t *)fp;
  iVar1 = read_tree_int(fp,"NODE",&local_28,0);
  if (iVar1 < 0) {
    fp_local._4_4_ = -1;
  }
  else if (local_28 == i) {
    iVar1 = read_tree_int((FILE *)node_local,"split_comp",&_n->split_comp,0);
    if (iVar1 < 0) {
      fp_local._4_4_ = -1;
    }
    else {
      iVar1 = read_tree_float((FILE *)node_local,"split_plane",&_n->split_plane,0);
      if (iVar1 < 0) {
        fp_local._4_4_ = -1;
      }
      else {
        iVar1 = read_tree_int((FILE *)node_local,"bbi",&local_28,1);
        if (iVar1 < 0) {
          fp_local._4_4_ = -1;
        }
        else {
          puVar4 = (uint8 *)__ckd_calloc__((ulong)_n->n_density,1,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                           ,0x1ad);
          _n->bbi = puVar4;
          if (1 < iVar1) {
            if (_n->n_density <= local_28) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                      ,0x1b0,"BBI Gaussian %d out of range! %d\n",(ulong)local_28);
              return -1;
            }
            _n->bbi[local_28] = '\x01';
            while ((uVar2 = __isoc99_fscanf(node_local,"%d",&local_28), uVar2 != 0 &&
                   (iVar3 = feof((FILE *)node_local), iVar3 == 0))) {
              if (_n->n_density <= local_28) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                        ,0x1b8,"BBI Gaussian %d out of range! %d\n",(ulong)local_28,(ulong)uVar2);
                return -1;
              }
              _n->bbi[local_28] = '\x01';
            }
          }
          if (i == 1) {
            fp_local._4_4_ = 0;
          }
          else {
            pkVar5 = (kd_tree_node_t *)
                     __ckd_calloc__(1,0x58,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                    ,0x1c2);
            _n->left = pkVar5;
            _n->left->n_density = _n->n_density;
            _n->left->n_comp = _n->n_comp;
            iVar1 = read_kd_nodes((FILE *)node_local,_n->left,i - 1);
            if (iVar1 < 0) {
              fp_local._4_4_ = -1;
            }
            else {
              pkVar5 = (kd_tree_node_t *)
                       __ckd_calloc__(1,0x58,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                      ,0x1c7);
              _n->right = pkVar5;
              _n->right->n_density = _n->n_density;
              _n->right->n_comp = _n->n_comp;
              iVar1 = read_kd_nodes((FILE *)node_local,_n->right,i - 1);
              if (iVar1 < 0) {
                fp_local._4_4_ = -1;
              }
              else {
                fp_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
            ,0x1a4,"Levels for node don\'t match (%d != %d)\n",(ulong)local_28,(ulong)(uint)i);
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

int32
read_kd_nodes(FILE *fp, kd_tree_node_t *node, uint32 level)
{
	uint32 n;
	int i;

	if (read_tree_int(fp, "NODE", &n, FALSE) < 0)
		return -1;
	if (n != level) {
		E_ERROR("Levels for node don't match (%d != %d)\n", n, level);
		return -1;
	}
	if (read_tree_int(fp, "split_comp", &node->split_comp, FALSE) < 0)
		return -1;
	if (read_tree_float(fp, "split_plane", &node->split_plane, FALSE) < 0)
		return -1;
	if ((i = read_tree_int(fp, "bbi", &n, TRUE)) < 0)
		return -1;
	node->bbi = ckd_calloc(node->n_density, sizeof(*node->bbi));
	if (i > 1) {
		if (n >= node->n_density) {
			E_ERROR("BBI Gaussian %d out of range! %d\n", n);
			return -1;
		}
		node->bbi[n] = 1;
		while ((i = fscanf(fp, "%d", &n))) {
			if (feof(fp))
				break;
			if (n >= node->n_density) {
				E_ERROR("BBI Gaussian %d out of range! %d\n", n, i);
				return -1;
			}
			node->bbi[n] = 1;
		}
	}

	if (level == 1)
		return 0;

	node->left = ckd_calloc(1, sizeof(*node->left));
	node->left->n_density = node->n_density;
	node->left->n_comp = node->n_comp;
	if (read_kd_nodes(fp, node->left, level-1) < 0)
		return -1;
	node->right = ckd_calloc(1, sizeof(*node->left));
	node->right->n_density = node->n_density;
	node->right->n_comp = node->n_comp;
	if (read_kd_nodes(fp, node->right, level-1) < 0)
		return -1;
	return 0;
}